

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_triag_mesh_builder.h
# Opt level: O3

void __thiscall
lf::mesh::utils::TPTriagMeshBuilder::TPTriagMeshBuilder
          (TPTriagMeshBuilder *this,
          unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>
          *mesh_factory)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  pointer *__ptr;
  stringstream ss;
  _Head_base<0UL,_lf::mesh::MeshFactory_*,_false> local_218;
  string local_210;
  string local_1f0;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  local_218._M_head_impl =
       (mesh_factory->_M_t).
       super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>.
       _M_t.
       super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
       super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl;
  (mesh_factory->_M_t).
  super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>._M_t.
  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
  super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl = (MeshFactory *)0x0;
  StructuredMeshBuilder::StructuredMeshBuilder
            (&this->super_StructuredMeshBuilder,
             (unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *)
             &local_218);
  if (local_218._M_head_impl != (MeshFactory *)0x0) {
    (*(local_218._M_head_impl)->_vptr_MeshFactory[7])();
  }
  local_218._M_head_impl = (MeshFactory *)0x0;
  (this->super_StructuredMeshBuilder)._vptr_StructuredMeshBuilder =
       (_func_int **)&PTR_Build_00354468;
  iVar3 = (**((this->super_StructuredMeshBuilder).mesh_factory_._M_t.
              super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>
              ._M_t.
              super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
              .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl)->
             _vptr_MeshFactory)();
  if (iVar3 == 2) {
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a0,"TPTriagMeshBuilder can only construct meshes with DimWorld==2",0x3d);
  paVar1 = &local_1f0.field_2;
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"mesh_factory_->DimWorld() == 2","");
  paVar2 = &local_210.field_2;
  local_210._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/tp_triag_mesh_builder.h"
             ,"");
  std::__cxx11::stringbuf::str();
  lf::base::AssertionFailed(&local_1f0,&local_210,0x23,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"false","");
  local_210._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/tp_triag_mesh_builder.h"
             ,"");
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
  lf::base::AssertionFailed(&local_1f0,&local_210,0x23,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  abort();
}

Assistant:

explicit TPTriagMeshBuilder(std::unique_ptr<mesh::MeshFactory> mesh_factory)
      : StructuredMeshBuilder(std::move(mesh_factory)) {
    LF_ASSERT_MSG(
        mesh_factory_->DimWorld() == 2,
        "TPTriagMeshBuilder can only construct meshes with DimWorld==2");
  }